

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt)

{
  xmlRegStatePtr pxVar1;
  int iVar2;
  xmlRegTrans *pxVar3;
  xmlRegTrans *pxVar4;
  uint local_4c;
  int local_48;
  int deep;
  int ret;
  int i;
  xmlRegTransPtr last;
  xmlRegTransPtr t2;
  xmlRegTransPtr t1;
  xmlRegStatePtr state;
  int transnr;
  int statenr;
  xmlRegParserCtxtPtr ctxt_local;
  
  local_48 = 1;
  if (ctxt->determinist == -1) {
    local_4c = (uint)((ctxt->flags & 1U) == 0);
    for (state._4_4_ = 0; state._4_4_ < ctxt->nbStates; state._4_4_ = state._4_4_ + 1) {
      pxVar1 = ctxt->states[state._4_4_];
      if ((pxVar1 != (xmlRegStatePtr)0x0) && (1 < pxVar1->nbTrans)) {
        for (state._0_4_ = 0; (int)state < pxVar1->nbTrans; state._0_4_ = (int)state + 1) {
          pxVar3 = pxVar1->trans + (int)state;
          if ((pxVar3->atom != (xmlRegAtomPtr)0x0) && (pxVar3->to != -1)) {
            for (deep = 0; deep < (int)state; deep = deep + 1) {
              pxVar4 = pxVar1->trans + deep;
              if (((((pxVar4->to != -1) && (pxVar4->atom != (xmlRegAtomPtr)0x0)) &&
                   (pxVar3->to == pxVar4->to)) &&
                  ((iVar2 = xmlFAEqualAtoms(pxVar3->atom,pxVar4->atom,local_4c), iVar2 != 0 &&
                   (pxVar3->counter == pxVar4->counter)))) && (pxVar3->count == pxVar4->count)) {
                pxVar4->to = -1;
              }
            }
          }
        }
      }
    }
    for (state._4_4_ = 0; state._4_4_ < ctxt->nbStates; state._4_4_ = state._4_4_ + 1) {
      pxVar1 = ctxt->states[state._4_4_];
      if ((pxVar1 != (xmlRegStatePtr)0x0) && (1 < pxVar1->nbTrans)) {
        _ret = (xmlRegTrans *)0x0;
        for (state._0_4_ = 0; (int)state < pxVar1->nbTrans; state._0_4_ = (int)state + 1) {
          pxVar3 = pxVar1->trans + (int)state;
          if ((pxVar3->atom != (xmlRegAtomPtr)0x0) && (pxVar3->to != -1)) {
            for (deep = 0; deep < (int)state; deep = deep + 1) {
              pxVar4 = pxVar1->trans + deep;
              if (pxVar4->to != -1) {
                if (pxVar4->atom == (xmlRegAtomPtr)0x0) {
                  if (pxVar3->to != -1) {
                    local_48 = xmlFARecurseDeterminism
                                         (ctxt,ctxt->states[pxVar3->to],pxVar4->to,pxVar4->atom);
                    xmlFAFinishRecurseDeterminism(ctxt,ctxt->states[pxVar3->to]);
                    if (local_48 == 0) {
                      pxVar3->nd = 1;
                      _ret = pxVar3;
                    }
                  }
                }
                else {
                  iVar2 = xmlFACompareAtoms(pxVar3->atom,pxVar4->atom,1);
                  if (iVar2 != 0) {
                    local_48 = 0;
                    pxVar3->nd = 1;
                    pxVar4->nd = 1;
                    _ret = pxVar3;
                  }
                }
              }
            }
          }
        }
        if (_ret != (xmlRegTrans *)0x0) {
          _ret->nd = 2;
        }
      }
    }
    ctxt->determinist = local_48;
    ctxt_local._4_4_ = local_48;
  }
  else {
    ctxt_local._4_4_ = ctxt->determinist;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    xmlRegTransPtr t1, t2, last;
    int i;
    int ret = 1;
    int deep = 1;

#ifdef DEBUG_REGEXP_GRAPH
    printf("xmlFAComputesDeterminism\n");
    xmlRegPrintCtxt(stdout, ctxt);
#endif
    if (ctxt->determinist != -1)
	return(ctxt->determinist);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * First cleanup the automata removing cancelled transitions
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		/* t1->nd = 1; */
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
		    if (t1->to == t2->to) {
                        /*
                         * Here we use deep because we want to keep the
                         * transitions which indicate a conflict
                         */
			if (xmlFAEqualAtoms(t1->atom, t2->atom, deep) &&
                            (t1->counter == t2->counter) &&
                            (t1->count == t2->count))
			    t2->to = -1; /* eliminated */
		    }
		}
	    }
	}
    }

    /*
     * Check for all states that there aren't 2 transitions
     * with the same atom and a different target.
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	last = NULL;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
                    /*
                     * But here we don't use deep because we want to
                     * find transitions which indicate a conflict
                     */
		    if (xmlFACompareAtoms(t1->atom, t2->atom, 1)) {
			ret = 0;
			/* mark the transitions as non-deterministic ones */
			t1->nd = 1;
			t2->nd = 1;
			last = t1;
		    }
		} else if (t1->to != -1) {
		    /*
		     * do the closure in case of remaining specific
		     * epsilon transitions like choices or all
		     */
		    ret = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
						   t2->to, t2->atom);
                    xmlFAFinishRecurseDeterminism(ctxt, ctxt->states[t1->to]);
		    /* don't shortcut the computation so all non deterministic
		       transition get marked down
		    if (ret == 0)
			return(0);
		     */
		    if (ret == 0) {
			t1->nd = 1;
			/* t2->nd = 1; */
			last = t1;
		    }
		}
	    }
	    /* don't shortcut the computation so all non deterministic
	       transition get marked down
	    if (ret == 0)
		break; */
	}

	/*
	 * mark specifically the last non-deterministic transition
	 * from a state since there is no need to set-up rollback
	 * from it
	 */
	if (last != NULL) {
	    last->nd = 2;
	}

	/* don't shortcut the computation so all non deterministic
	   transition get marked down
	if (ret == 0)
	    break; */
    }

    ctxt->determinist = ret;
    return(ret);
}